

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

int __thiscall QPDFWriter::openObject(QPDFWriter *this,int objid)

{
  element_type *peVar1;
  string *psVar2;
  size_type sVar3;
  size_type *psVar4;
  NewObject *pNVar5;
  string_view str;
  string_view str_00;
  string local_38;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (objid == 0) {
    objid = peVar1->next_objid;
    peVar1->next_objid = objid + 1;
  }
  psVar2 = peVar1->pipeline->str;
  psVar4 = (size_type *)&peVar1->pipeline->count;
  if (psVar2 != (string *)0x0) {
    psVar4 = &psVar2->_M_string_length;
  }
  sVar3 = *psVar4;
  pNVar5 = ObjTable<QPDFWriter::NewObject>::operator[]
                     (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,objid);
  (pNVar5->xref).type = 1;
  (pNVar5->xref).field1 = sVar3;
  (pNVar5->xref).field2 = 0;
  std::__cxx11::to_string(&local_38,objid);
  str._M_str = local_38._M_dataplus._M_p;
  str._M_len = local_38._M_string_length;
  writeString(this,str);
  std::__cxx11::string::~string((string *)&local_38);
  str_00._M_str = " 0 obj\n";
  str_00._M_len = 7;
  writeString(this,str_00);
  return objid;
}

Assistant:

int
QPDFWriter::openObject(int objid)
{
    if (objid == 0) {
        objid = m->next_objid++;
    }
    m->new_obj[objid].xref = QPDFXRefEntry(m->pipeline->getCount());
    writeString(std::to_string(objid));
    writeString(" 0 obj\n");
    return objid;
}